

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

void envydis(disisa *isa,FILE *out,uint8_t *code,uint32_t start,int num,varinfo *varinfo,int quiet,
            label *labels,int labelsnum,envy_colors *cols)

{
  uint8_t uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint32_t uVar7;
  dis_res *pdVar8;
  int fl;
  dis_res *dres_2;
  uint32_t val_2;
  uint16_t val_1;
  uint8_t val;
  int mark;
  int nonzero;
  int skip;
  int active;
  dis_res *dres_1;
  dis_res *dres;
  int active_1;
  int done;
  int cbsz;
  int stride;
  int j;
  int i;
  int cur;
  decoctx *ctx;
  decoctx c;
  varinfo *varinfo_local;
  int num_local;
  uint32_t start_local;
  uint8_t *code_local;
  FILE *out_local;
  disisa *isa_local;
  
  c._56_8_ = varinfo;
  memset(&ctx,0,0x40);
  j = 0;
  c.varinfo = (varinfo *)code;
  c.names._4_4_ = num;
  c.code = (uint8_t *)calloc((long)num,4);
  c.marks = (int *)calloc((long)num,8);
  c.isa = (disisa *)c._56_8_;
  c._40_8_ = labels;
  c.labels._0_4_ = labelsnum;
  ctx = (decoctx *)isa;
  c.names._0_4_ = start;
  iVar6 = ed_getcstride(isa,(varinfo *)c._56_8_);
  uVar7 = ed_getcbsz((disisa *)ctx,(varinfo *)c.isa);
  if (labels == (label *)0x0) {
    while (j < num) {
      pdVar8 = do_dis((decoctx *)&ctx,j);
      dis_dopp((decoctx *)&ctx,pdVar8,(ulong)(j + start));
      if (pdVar8->oplen == 0) {
        j = j + 1;
      }
      else {
        j = pdVar8->oplen + j;
      }
      dis_del_res(pdVar8);
    }
  }
  else {
    for (stride = 0; stride < labelsnum; stride = stride + 1) {
      ::mark((decoctx *)&ctx,(uint32_t)labels[stride].val,labels[stride].type);
      if ((((ulong)(uint32_t)c.names <= labels[stride].val) &&
          (labels[stride].val < (ulong)((uint32_t)c.names + c.names._4_4_))) &&
         (labels[stride].name != (char *)0x0)) {
        *(char **)(c.marks + (labels[stride].val - (ulong)(uint32_t)c.names) * 2) =
             labels[stride].name;
      }
      if (labels[stride].size != 0) {
        for (cbsz = 0; (uint)cbsz < labels[stride].size; cbsz = cbsz + 4) {
          ::mark((decoctx *)&ctx,(int)labels[stride].val + cbsz,labels[stride].type);
        }
      }
    }
    do {
      bVar4 = true;
      j = 0;
      bVar3 = false;
      while (j < num) {
        if (((!bVar3) && ((*(uint *)(c.code + (long)j * 4) & 3) != 0)) &&
           ((*(uint *)(c.code + (long)j * 4) & 8) == 0)) {
          bVar4 = false;
          bVar3 = true;
          *(uint *)(c.code + (long)j * 4) = *(uint *)(c.code + (long)j * 4) | 8;
        }
        if (bVar3) {
          pdVar8 = do_dis((decoctx *)&ctx,j);
          dis_dopp((decoctx *)&ctx,pdVar8,(ulong)(j + start));
          if (((pdVar8->oplen == 0) || (pdVar8->endmark != 0)) ||
             ((*(uint *)(c.code + (long)j * 4) & 4) != 0)) {
            bVar3 = false;
          }
          else {
            j = pdVar8->oplen + j;
          }
          dis_del_res(pdVar8);
        }
        else {
          j = j + 1;
        }
      }
    } while (!bVar4);
  }
  j = 0;
  bVar4 = false;
  mark = 0;
  bVar3 = false;
  while( true ) {
    while( true ) {
      if (num <= j) {
        free(c.code);
        free(c.marks);
        return;
      }
      uVar2 = *(uint *)(c.code + (long)j * 4);
      if (*(long *)(c.marks + (long)j * 2) != 0) {
        if (mark != 0) {
          if (bVar3) {
            fprintf((FILE *)out,"%s[%x bytes skipped]\n",cols->err,(ulong)(uint)mark);
          }
          else {
            fprintf((FILE *)out,"%s[%x zero bytes skipped]\n",cols->reset,(ulong)(uint)mark);
          }
          mark = 0;
          bVar3 = false;
        }
        if ((uVar2 & 0x1b0) == 0) {
          if ((uVar2 & 2) == 0) {
            if ((uVar2 & 1) == 0) {
              fprintf((FILE *)out,"%s%s:\n",cols->reset,*(undefined8 *)(c.marks + (long)j * 2));
            }
            else {
              fprintf((FILE *)out,"%s%s:\n",cols->btarg,*(undefined8 *)(c.marks + (long)j * 2));
            }
          }
          else {
            fprintf((FILE *)out,"\n%s%s:\n",cols->ctarg,*(undefined8 *)(c.marks + (long)j * 2));
          }
        }
        else {
          fprintf((FILE *)out,"%s%s:\n",cols->reset,*(undefined8 *)(c.marks + (long)j * 2));
        }
      }
      if (((uVar2 & 0x1b0) != 0) && (!bVar4)) break;
      if ((!bVar4) && ((uVar2 & 7) != 0)) {
        bVar4 = true;
      }
      if ((bVar4) || (labels == (label *)0x0)) {
        if (mark != 0) {
          if (bVar3) {
            fprintf((FILE *)out,"%s[%x bytes skipped]\n",cols->err,(ulong)(uint)mark);
          }
          else {
            fprintf((FILE *)out,"%s[%x zero bytes skipped]\n",cols->reset,(ulong)(uint)mark);
          }
          mark = 0;
          bVar3 = false;
        }
        pdVar8 = do_dis((decoctx *)&ctx,j);
        dis_dopp((decoctx *)&ctx,pdVar8,(ulong)(j + start));
        if ((pdVar8->endmark != 0) || ((uVar2 & 4) != 0)) {
          bVar4 = false;
        }
        if (((uVar2 & 2) != 0) && (*(long *)(c.marks + (long)j * 2) == 0)) {
          fprintf((FILE *)out,"\n");
        }
        switch(uVar2 & 3) {
        case 0:
          if (quiet == 0) {
            fprintf((FILE *)out,"%s%08x:%s",cols->reset,(ulong)(j + start),cols->reset);
          }
          break;
        case 1:
          fprintf((FILE *)out,"%s%08x:%s",cols->btarg,(ulong)(j + start),cols->reset);
          break;
        case 2:
          fprintf((FILE *)out,"%s%08x:%s",cols->ctarg,(ulong)(j + start),cols->reset);
          break;
        case 3:
          fprintf((FILE *)out,"%s%08x:%s",cols->bctarg,(ulong)(j + start),cols->reset);
        }
        if (quiet == 0) {
          for (stride = 0; stride < isa->maxoplen; stride = isa->opunit + stride) {
            fprintf((FILE *)out," ");
            cbsz = isa->opunit * iVar6;
            while (cbsz = cbsz + -1, -1 < cbsz) {
              if ((stride + cbsz / iVar6 == 0) || ((uint)(stride + cbsz / iVar6) < pdVar8->oplen)) {
                if (j + stride + cbsz / iVar6 < num) {
                  fprintf((FILE *)out,"%s%02x",cols->reset,(ulong)code[(j + stride) * iVar6 + cbsz])
                  ;
                }
                else {
                  fprintf((FILE *)out,"%s??",cols->err);
                }
              }
              else {
                fprintf((FILE *)out,"  ",(long)cbsz % (long)iVar6 & 0xffffffff);
              }
            }
          }
          fprintf((FILE *)out,"  ");
          if ((uVar2 & 2) == 0) {
            fprintf((FILE *)out," ");
          }
          else {
            fprintf((FILE *)out,"%sC",cols->ctarg);
          }
          if ((uVar2 & 1) == 0) {
            fprintf((FILE *)out," ");
          }
          else {
            fprintf((FILE *)out,"%sB",cols->btarg);
          }
          fprintf((FILE *)out," ");
        }
        else if ((quiet == 1) && (uVar2 != 0)) {
          fprintf((FILE *)out,"\n");
        }
        easm_print_insn(out,cols,pdVar8->insn);
        if ((pdVar8->status & DIS_STATUS_UNK_FORM) == DIS_STATUS_OK) {
          bVar5 = false;
          for (stride = pdVar8->oplen; stride < 0x10; stride = stride + 1) {
            pdVar8->a[stride / 8] =
                 (0xffL << (sbyte)((stride & 7U) << 3) ^ 0xffffffffffffffffU) &
                 pdVar8->a[stride / 8];
          }
          for (stride = 0; stride < 2; stride = stride + 1) {
            pdVar8->a[stride] = (pdVar8->m[stride] ^ 0xffffffffffffffff) & pdVar8->a[stride];
            if (pdVar8->a[stride] != 0) {
              bVar5 = true;
            }
          }
          if (bVar5) {
            fprintf((FILE *)out," %s[unknown:",cols->err);
            for (stride = 0; (uint)stride < pdVar8->oplen || stride == 0;
                stride = isa->opunit + stride) {
              fprintf((FILE *)out," ");
              cbsz = isa->opunit * iVar6;
              while (cbsz = cbsz + -1, -1 < cbsz) {
                if (j + stride + cbsz < num) {
                  fprintf((FILE *)out,"%02llx",
                          pdVar8->a[(stride + cbsz) / 8] >> (sbyte)((stride + cbsz & 7U) << 3) &
                          0xff);
                }
                else {
                  fprintf((FILE *)out,"??");
                }
              }
            }
            fprintf((FILE *)out,"]");
          }
        }
        else {
          fprintf((FILE *)out," %s[unknown op length]%s",cols->err,cols->reset);
        }
        if ((pdVar8->status & DIS_STATUS_EOF) != DIS_STATUS_OK) {
          fprintf((FILE *)out," %s[incomplete]%s",cols->err,cols->reset);
        }
        if ((pdVar8->status & DIS_STATUS_UNK_INSN) != DIS_STATUS_OK) {
          fprintf((FILE *)out," %s[unknown instruction]%s",cols->err,cols->reset);
        }
        if ((pdVar8->status & DIS_STATUS_UNK_OPERAND) != DIS_STATUS_OK) {
          fprintf((FILE *)out," %s[unknown operand]%s",cols->err,cols->reset);
        }
        fprintf((FILE *)out,"%s\n",cols->reset);
        j = pdVar8->oplen + j;
        dis_del_res(pdVar8);
      }
      else {
        for (stride = 0; stride < iVar6; stride = stride + 1) {
          if (code[j * iVar6 + stride] != '\0') {
            bVar3 = true;
          }
        }
        j = j + 1;
        mark = mark + 1;
      }
    }
    if (mark != 0) {
      if (bVar3) {
        fprintf((FILE *)out,"%s[%x bytes skipped]\n",cols->err,(ulong)(uint)mark);
      }
      else {
        fprintf((FILE *)out,"%s[%x zero bytes skipped]\n",cols->reset,(ulong)(uint)mark);
      }
      mark = 0;
      bVar3 = false;
    }
    if (uVar7 != 8) break;
    fprintf((FILE *)out,"%s%08x:%s",cols->mem,(ulong)(j + start),cols->reset);
    if ((uVar2 & 0x80) == 0) {
      if ((uVar2 & 0x100) == 0) {
        if ((uVar2 & 0x10) == 0) {
          fprintf((FILE *)out," %s\"",cols->num);
          for (; code[j] != '\0'; j = j + 1) {
            uVar1 = code[j];
            if (uVar1 == '\n') {
              fprintf((FILE *)out,"\\n");
            }
            else if (uVar1 == '\"') {
              fprintf((FILE *)out,"\\\"");
            }
            else if (uVar1 == '\\') {
              fprintf((FILE *)out,"\\\\");
            }
            else {
              fprintf((FILE *)out,"%c",(ulong)code[j]);
            }
          }
          j = j + 1;
          fprintf((FILE *)out,"\"\n");
        }
        else {
          dres_2._0_4_ = 0;
          for (stride = 0; stride < 4 && j + stride < num; stride = stride + 1) {
            dres_2._0_4_ = (uint)code[j + stride] << ((byte)(stride << 3) & 0x1f) | (uint)dres_2;
          }
          fprintf((FILE *)out," %s%08x\n",cols->num,(ulong)(uint)dres_2);
          j = j + 4;
        }
      }
      else {
        dres_2._4_2_ = 0;
        for (stride = 0; stride < 2 && j + stride < num; stride = stride + 1) {
          dres_2._4_2_ = dres_2._4_2_ | (ushort)code[j + stride] << ((byte)(stride << 3) & 0x1f);
        }
        fprintf((FILE *)out," %s%04x\n",cols->num,(ulong)dres_2._4_2_);
        j = j + 2;
      }
    }
    else {
      fprintf((FILE *)out," %s%02x\n",cols->num,(ulong)code[j]);
      j = j + 1;
    }
  }
  abort();
}

Assistant:

void envydis (const struct disisa *isa, FILE *out, uint8_t *code, uint32_t start, int num, struct varinfo *varinfo, int quiet, struct label *labels, int labelsnum, const struct envy_colors *cols)
{
	struct decoctx c = { 0 };
	struct decoctx *ctx = &c;
	int cur = 0, i, j;
	ctx->code = code;
	ctx->codesz = num;
	ctx->marks = calloc(num, sizeof *ctx->marks);
	ctx->names = calloc(num, sizeof *ctx->names);
	ctx->codebase = start;
	ctx->varinfo = varinfo;
	ctx->isa = isa;
	ctx->labels = labels;
	ctx->labelsnum = labelsnum;
	int stride = ed_getcstride(ctx->isa, ctx->varinfo);
	int cbsz = ed_getcbsz(ctx->isa, ctx->varinfo);
	if (labels) {
		for (i = 0; i < labelsnum; i++) {
			mark(ctx, labels[i].val, labels[i].type);
			if (labels[i].val >= ctx->codebase && labels[i].val < ctx->codebase + ctx->codesz) {
				if (labels[i].name)
					ctx->names[labels[i].val - ctx->codebase] = labels[i].name;
			}
			if (labels[i].size) {
				for (j = 0; j < labels[i].size; j+=4)
					mark(ctx, labels[i].val + j, labels[i].type);
			}
		}
		int done;
		do {
			done = 1;
			cur = 0;
			int active = 0;
			while (cur < num) {
				if (!active && (ctx->marks[cur] & 3) && !(ctx->marks[cur] & 8)) {
					done = 0;
					active = 1;
					ctx->marks[cur] |= 8;
				}
				if (active) {
					struct dis_res *dres = do_dis(ctx, cur);
					dis_dopp(ctx, dres, cur + start);
					if (dres->oplen && !dres->endmark && !(ctx->marks[cur] & 4))
						cur += dres->oplen;
					else
						active = 0;
					dis_del_res(dres);
				} else {
					cur++;
				}
			}
		} while (!done);
	} else {
		while (cur < num) {
			struct dis_res *dres = do_dis(ctx, cur);
			dis_dopp(ctx, dres, cur + start);
			if (dres->oplen)
				cur += dres->oplen;
			else
				cur++;
			dis_del_res(dres);
		}
	}
	cur = 0;
	int active = 0;
	int skip = 0, nonzero = 0;
	while (cur < num) {
		int mark = ctx->marks[cur];
		if (ctx->names[cur]) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
				skip = 0;
				nonzero = 0;
			}
			if (mark & 0x1b0)
				fprintf (out, "%s%s:\n", cols->reset, ctx->names[cur]);
			else if (mark & 2)
				fprintf (out, "\n%s%s:\n", cols->ctarg, ctx->names[cur]);
			else if (mark & 1)
				fprintf (out, "%s%s:\n", cols->btarg, ctx->names[cur]);
			else
				fprintf (out, "%s%s:\n", cols->reset, ctx->names[cur]);
		}
		if (mark & 0x1b0 && !active) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
				skip = 0;
				nonzero = 0;
			}
			if (cbsz != 8)
				abort();
			fprintf (out, "%s%08x:%s", cols->mem, cur + start, cols->reset);
			if (mark & 0x80) {
				uint8_t val = code[cur];
				fprintf (out, " %s%02x\n", cols->num, val);
				cur += 1;
			} else if (mark & 0x100) {
				uint16_t val = 0;
				for (i = 0; i < 2 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%04x\n", cols->num, val);
				cur += 2;
			} else if (mark & 0x10) {
				uint32_t val = 0;
				for (i = 0; i < 4 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%08x\n", cols->num, val);
				cur += 4;
			} else {
				fprintf (out, " %s\"", cols->num);
				while (code[cur]) {
					switch (code[cur]) {
						case '\n':
							fprintf (out, "\\n");
							break;
						case '\\':
							fprintf (out, "\\\\");
							break;
						case '\"':
							fprintf (out, "\\\"");
							break;
						default:
							fprintf (out, "%c", code[cur]);
							break;
					}
					cur++;
				}
				cur++;
				fprintf (out, "\"\n");
			}
			continue;
		}
		if (!active && mark & 7)
			active = 1;
		if (!active && labels) {
			for (i = 0; i < stride; i++)
				if (code[cur*stride+i])
					nonzero = 1;
			cur++;
			skip++;
			continue;
		}
		if (skip) {
			if (nonzero)
				fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
			else
				fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
			skip = 0;
			nonzero = 0;
		}
		struct dis_res *dres = do_dis(ctx, cur);
		dis_dopp(ctx, dres, cur + start);

		if (dres->endmark || mark & 4)
			active = 0;

		if (mark & 2 && !ctx->names[cur])
			fprintf (out, "\n");
		switch (mark & 3) {
			case 0:
				if (!quiet)
					fprintf (out, "%s%08x:%s", cols->reset, cur + start, cols->reset);
				break;
			case 1:
				fprintf (out, "%s%08x:%s", cols->btarg, cur + start, cols->reset);
				break;
			case 2:
				fprintf (out, "%s%08x:%s", cols->ctarg, cur + start, cols->reset);
				break;
			case 3:
				fprintf (out, "%s%08x:%s", cols->bctarg, cur + start, cols->reset);
				break;
		}

		if (!quiet) {
			for (i = 0; i < isa->maxoplen; i += isa->opunit) {
				fprintf (out, " ");
				for (j = isa->opunit*stride - 1; j >= 0; j--)
					if (i+j/stride && i+j/stride >= dres->oplen) {
						fprintf (out, "  ");
					} else if (cur+i+j/stride >= num) {
						fprintf (out, "%s??", cols->err);
					} else {
						fprintf (out, "%s%02x", cols->reset, code[(cur + i)*stride + j]);
					}
			}
			fprintf (out, "  ");

			if (mark & 2)
				fprintf (out, "%sC", cols->ctarg);
			else
				fprintf (out, " ");
			if (mark & 1)
				fprintf (out, "%sB", cols->btarg);
			else
				fprintf (out, " ");
			fprintf(out, " ");
		} else if (quiet == 1) {
			if (mark)
				fprintf (out, "\n");
		}

		easm_print_insn(out, cols, dres->insn);

		if (dres->status & DIS_STATUS_UNK_FORM) {
			fprintf (out, " %s[unknown op length]%s", cols->err, cols->reset);
		} else {
			int fl = 0;
			for (i = dres->oplen; i < MAXOPLEN * 8; i++)
				dres->a[i/8] &= ~(0xffull << (i & 7) * 8);
			for (i = 0; i < MAXOPLEN; i++) {
				dres->a[i] &= ~dres->m[i];
				if (dres->a[i])
					fl = 1;
			}
			if (fl) {
				fprintf (out, " %s[unknown:", cols->err);
				for (i = 0; i < dres->oplen || i == 0; i += isa->opunit) {
					fprintf (out, " ");
					for (j = isa->opunit*stride - 1; j >= 0; j--)
						if (cur+i+j >= num)
							fprintf (out, "??");
						else
							fprintf (out, "%02llx", (dres->a[(i+j)/8] >> ((i + j)&7) * 8) & 0xff);
				}
				fprintf (out, "]");
			}
		}
		if (dres->status & DIS_STATUS_EOF) {
			fprintf (out, " %s[incomplete]%s", cols->err, cols->reset);
		}
		if (dres->status & DIS_STATUS_UNK_INSN) {
			fprintf (out, " %s[unknown instruction]%s", cols->err, cols->reset);
		}
		if (dres->status & DIS_STATUS_UNK_OPERAND) {
			fprintf (out, " %s[unknown operand]%s", cols->err, cols->reset);
		}
		fprintf (out, "%s\n", cols->reset);
		cur += dres->oplen;

		dis_del_res(dres);
	}
	free(ctx->marks);
	free(ctx->names);
}